

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

void sysbvm_functionDefinition_analyzeType
               (sysbvm_context_t *context,sysbvm_functionDefinition_t **functionDefinition)

{
  sysbvm_tuple_t environment_;
  size_t slotCount;
  sysbvm_tuple_t argumentNodes;
  sysbvm_tuple_t sVar1;
  sysbvm_bitflags_t sVar2;
  sysbvm_tuple_t argumentBindings;
  sysbvm_tuple_t localBindings;
  sysbvm_bitflags_t flags;
  size_t i;
  size_t argumentNodeCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_72_9_7cb38521 gcFrame;
  sysbvm_functionDefinition_t **functionDefinition_local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,0x48);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_COUNT;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)(*functionDefinition)->sourceDefinition;
  gcFrame.sourceDefinition =
       (sysbvm_functionSourceDefinition_t *)(*functionDefinition)->sourceAnalyzedDefinition;
  if (gcFrame.sourceDefinition == (sysbvm_functionSourceDefinition_t *)0x0) {
    gcFrame.sourceDefinition =
         (sysbvm_functionSourceDefinition_t *)
         sysbvm_context_allocatePointerTuple
                   (context,(context->roots).functionSourceAnalyzedDefinitionType,8);
    *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)
     &(gcFrame.sourceDefinition)->sourcePosition =
         *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(gcFrameRecord.roots + 2);
    (*functionDefinition)->sourceAnalyzedDefinition = (sysbvm_tuple_t)gcFrame.sourceDefinition;
  }
  argumentNodeCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = (gcFrame.sourceDefinition)->sourcePosition;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&argumentNodeCount);
  environment_ = sysbvm_functionAnalysisEnvironment_create
                           (context,gcFrameRecord.roots[3],(sysbvm_tuple_t)*functionDefinition);
  slotCount = sysbvm_array_getSize(gcFrameRecord.roots[4]);
  argumentNodes = sysbvm_array_create(context,slotCount);
  for (flags = 0; flags < slotCount; flags = flags + 1) {
    sVar1 = sysbvm_array_at(gcFrameRecord.roots[4],flags);
    sVar1 = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment(context,sVar1,environment_);
    sysbvm_array_atPut(argumentNodes,flags,sVar1);
  }
  if (gcFrameRecord.roots[5] != 0) {
    gcFrame.analyzedBodyNode =
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                   (context,gcFrameRecord.roots[5],(context->roots).typeType,environment_);
  }
  sVar2 = sysbvm_tuple_bitflags_decode((*functionDefinition)->flags);
  sVar1 = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(environment_ + 0x98));
  argumentBindings =
       sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(environment_ + 0xa0));
  localBindings = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(environment_ + 0xa8))
  ;
  sVar1 = sysbvm_type_createDependentFunctionType
                    (context,argumentNodes,sVar2 & 0x602,gcFrame.analyzedBodyNode,environment_,sVar1
                     ,argumentBindings,localBindings);
  sVar1 = sysbvm_type_canonicalizeFunctionType(context,sVar1);
  (*functionDefinition)->type = sVar1;
  (gcFrame.sourceDefinition)->environment = environment_;
  gcFrame.sourceDefinition[1].header.field_0.typePointer = argumentNodes;
  gcFrame.sourceDefinition[1].header.identityHashAndFlags = (undefined4)gcFrame.analyzedBodyNode;
  gcFrame.sourceDefinition[1].header.objectSize = gcFrame.analyzedBodyNode._4_4_;
  *(undefined8 *)(environment_ + 0xd0) =
       *(undefined8 *)&gcFrame.sourceDefinition[1].header.identityHashAndFlags;
  (*functionDefinition)->bytecode = 0;
  (*functionDefinition)->nativeCodeDefinition = 0;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&argumentNodeCount);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return;
}

Assistant:

static void sysbvm_functionDefinition_analyzeType(sysbvm_context_t *context, sysbvm_functionDefinition_t **functionDefinition)
{
    struct {
        sysbvm_functionSourceDefinition_t *sourceDefinition;
        sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition;

        sysbvm_tuple_t analysisEnvironment;
        sysbvm_functionAnalysisEnvironment_t *analysisEnvironmentObject;
        sysbvm_tuple_t analyzedArgumentNode;
        sysbvm_tuple_t analyzedArgumentsNode;
        sysbvm_tuple_t analyzedBodyNode;
        sysbvm_tuple_t analyzedResultTypeNode;
        sysbvm_tuple_t analyzedType;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.sourceDefinition = (sysbvm_functionSourceDefinition_t*)(*functionDefinition)->sourceDefinition;
    gcFrame.sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)(*functionDefinition)->sourceAnalyzedDefinition;
    if(!gcFrame.sourceAnalyzedDefinition)
    {
        gcFrame.sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionSourceAnalyzedDefinitionType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionSourceAnalyzedDefinition_t));
        gcFrame.sourceAnalyzedDefinition->sourcePosition = gcFrame.sourceDefinition->sourcePosition;
        (*functionDefinition)->sourceAnalyzedDefinition = (sysbvm_tuple_t)gcFrame.sourceAnalyzedDefinition;
    }

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.sourceAnalyzedDefinition->sourcePosition);

    gcFrame.analysisEnvironment = sysbvm_functionAnalysisEnvironment_create(context, gcFrame.sourceDefinition->environment, (sysbvm_tuple_t)*functionDefinition);
    gcFrame.analysisEnvironmentObject = (sysbvm_functionAnalysisEnvironment_t*)gcFrame.analysisEnvironment;
    size_t argumentNodeCount = sysbvm_array_getSize(gcFrame.sourceDefinition->argumentNodes);
    gcFrame.analyzedArgumentsNode = sysbvm_array_create(context, argumentNodeCount);
    for(size_t i = 0; i < argumentNodeCount; ++i)
    {
        gcFrame.analyzedArgumentNode = sysbvm_array_at(gcFrame.sourceDefinition->argumentNodes, i);
        gcFrame.analyzedArgumentNode = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment(context, gcFrame.analyzedArgumentNode, gcFrame.analysisEnvironment);
        sysbvm_array_atPut(gcFrame.analyzedArgumentsNode, i, gcFrame.analyzedArgumentNode);
    }

    if(gcFrame.sourceDefinition->resultTypeNode)
        gcFrame.analyzedResultTypeNode = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sourceDefinition->resultTypeNode, context->roots.typeType, gcFrame.analysisEnvironment);

    sysbvm_bitflags_t flags = sysbvm_tuple_bitflags_decode((*functionDefinition)->flags) & SYSBVM_FUNCTION_TYPE_FLAGS;
    gcFrame.analyzedType = sysbvm_type_createDependentFunctionType(context, gcFrame.analyzedArgumentsNode, flags, gcFrame.analyzedResultTypeNode,
        gcFrame.analysisEnvironment,
        sysbvm_orderedCollection_asArray(context, gcFrame.analysisEnvironmentObject->captureBindingList),
        sysbvm_orderedCollection_asArray(context, gcFrame.analysisEnvironmentObject->argumentBindingList),
        sysbvm_orderedCollection_asArray(context, gcFrame.analysisEnvironmentObject->localBindingList)
    );
    gcFrame.analyzedType = sysbvm_type_canonicalizeFunctionType(context, gcFrame.analyzedType);

    (*functionDefinition)->type = gcFrame.analyzedType;
    gcFrame.sourceAnalyzedDefinition->environment = gcFrame.analysisEnvironment;
    gcFrame.sourceAnalyzedDefinition->argumentNodes = gcFrame.analyzedArgumentsNode;
    gcFrame.sourceAnalyzedDefinition->resultTypeNode = gcFrame.analyzedResultTypeNode;
    gcFrame.analysisEnvironmentObject->returnTypeExpression = gcFrame.sourceAnalyzedDefinition->resultTypeNode;

    (*functionDefinition)->bytecode = SYSBVM_NULL_TUPLE;
    (*functionDefinition)->nativeCodeDefinition = SYSBVM_NULL_TUPLE;

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
}